

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<void_(ot::commissioner::Error)>::Invoke
          (FunctionMocker<void_(ot::commissioner::Error)> *this,Error *args)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<void> *pAVar1;
  ArgumentTuple tuple;
  undefined1 auStack_38 [40];
  
  ot::commissioner::Error::Error((Error *)auStack_38,args);
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,auStack_38);
  pAVar1 = DownCast_<testing::internal::ActionResultHolder<void>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  if (pAVar1 != (ActionResultHolder<void> *)0x0) {
    (*(pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar1);
  }
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }